

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall
wallet::LegacyScriptPubKeyMan::KeepDestination
          (LegacyScriptPubKeyMan *this,int64_t nIndex,OutputType *type)

{
  long lVar1;
  byte bVar2;
  map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_> *this_00;
  int *in_RDX;
  WalletBatch *in_RDI;
  long in_FS_OFFSET;
  bool have_pk;
  WalletBatch batch;
  CPubKey pubkey;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  WalletBatch *in_stack_ffffffffffffff58;
  map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
  *in_stack_ffffffffffffff70;
  OutputType type_00;
  WalletBatch *key;
  LegacyScriptPubKeyMan *in_stack_ffffffffffffff98;
  undefined1 local_49 [17];
  ConstevalFormatString<1U> in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDX == 3) {
    __assert_fail("type != OutputType::BECH32M",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x570,
                  "virtual void wallet::LegacyScriptPubKeyMan::KeepDestination(int64_t, const OutputType &)"
                 );
  }
  key = in_RDI;
  (*in_RDI->m_database->_vptr_WalletDatabase[3])();
  type_00 = (OutputType)((ulong)in_RDX >> 0x20);
  WalletBatch::WalletBatch
            (in_stack_ffffffffffffff58,
             (WalletDatabase *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             (bool)in_stack_ffffffffffffff4f);
  WalletBatch::ErasePool(in_RDI,(int64_t)in_stack_ffffffffffffff70);
  CPubKey::CPubKey((CPubKey *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  this_00 = (map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_> *)
            std::map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
            ::at(in_stack_ffffffffffffff70,(key_type *)in_RDI);
  bVar2 = (*(code *)(in_RDI->m_batch)._M_t.
                    super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                    .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl[0x1f].
                    _vptr_DatabaseBatch)(in_RDI,this_00,local_49);
  if ((bVar2 & 1) != 0) {
    LearnRelatedScripts(in_stack_ffffffffffffff98,(CPubKey *)key,type_00);
    std::map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>::erase
              (this_00,(key_type *)CONCAT17(bVar2,in_stack_ffffffffffffff50));
    ScriptPubKeyMan::WalletLogPrintf<long>
              ((ScriptPubKeyMan *)in_stack_ffffffffffffff98,in_stack_ffffffffffffffc8,(long *)key);
    WalletBatch::~WalletBatch
              ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("have_pk",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                ,0x576,
                "virtual void wallet::LegacyScriptPubKeyMan::KeepDestination(int64_t, const OutputType &)"
               );
}

Assistant:

void LegacyScriptPubKeyMan::KeepDestination(int64_t nIndex, const OutputType& type)
{
    assert(type != OutputType::BECH32M);
    // Remove from key pool
    WalletBatch batch(m_storage.GetDatabase());
    batch.ErasePool(nIndex);
    CPubKey pubkey;
    bool have_pk = GetPubKey(m_index_to_reserved_key.at(nIndex), pubkey);
    assert(have_pk);
    LearnRelatedScripts(pubkey, type);
    m_index_to_reserved_key.erase(nIndex);
    WalletLogPrintf("keypool keep %d\n", nIndex);
}